

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int client_switch_proxy(archive_read_filter *self,uint iindex)

{
  void *pvVar1;
  int local_34;
  void *data2;
  int local_20;
  int r2;
  int r1;
  uint iindex_local;
  archive_read_filter *self_local;
  
  local_20 = 0;
  if ((self->archive->client).cursor == iindex) {
    self_local._4_4_ = 0;
  }
  else {
    (self->archive->client).cursor = iindex;
    pvVar1 = (self->archive->client).dataset[(self->archive->client).cursor].data;
    if ((self->archive->client).switcher == (archive_switch_callback *)0x0) {
      if ((self->archive->client).closer != (undefined1 *)0x0) {
        local_20 = (*(code *)(self->archive->client).closer)(self->archive,self->data);
      }
      self->data = pvVar1;
      data2._4_4_ = client_open_proxy(self);
    }
    else {
      data2._4_4_ = (*(self->archive->client).switcher)(&self->archive->archive,self->data,pvVar1);
      self->data = pvVar1;
      local_20 = data2._4_4_;
    }
    if (local_20 < data2._4_4_) {
      local_34 = local_20;
    }
    else {
      local_34 = data2._4_4_;
    }
    self_local._4_4_ = local_34;
  }
  return self_local._4_4_;
}

Assistant:

static int
client_switch_proxy(struct archive_read_filter *self, unsigned int iindex)
{
  int r1 = ARCHIVE_OK, r2 = ARCHIVE_OK;
	void *data2 = NULL;

	/* Don't do anything if already in the specified data node */
	if (self->archive->client.cursor == iindex)
		return (ARCHIVE_OK);

	self->archive->client.cursor = iindex;
	data2 = self->archive->client.dataset[self->archive->client.cursor].data;
	if (self->archive->client.switcher != NULL)
	{
		r1 = r2 = (self->archive->client.switcher)
			((struct archive *)self->archive, self->data, data2);
		self->data = data2;
	}
	else
	{
		/* Attempt to call close and open instead */
		if (self->archive->client.closer != NULL)
			r1 = (self->archive->client.closer)
				((struct archive *)self->archive, self->data);
		self->data = data2;
		r2 = client_open_proxy(self);
	}
	return (r1 < r2) ? r1 : r2;
}